

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

int SUNMatMatvec_Band(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  SUNMatrix_ID SVar5;
  N_Vector_ID NVar6;
  realtype *prVar7;
  realtype *prVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  SVar5 = SUNMatGetID(A);
  iVar9 = 1;
  if (SVar5 == SUNMATRIX_BAND) {
    NVar6 = N_VGetVectorID(x);
    if (((NVar6 != SUNDIALS_NVEC_SERIAL) &&
        (NVar6 = N_VGetVectorID(x), NVar6 != SUNDIALS_NVEC_OPENMP)) &&
       (NVar6 = N_VGetVectorID(x), NVar6 != SUNDIALS_NVEC_PTHREADS)) {
      return 1;
    }
    prVar7 = N_VGetArrayPointer(x);
    prVar8 = N_VGetArrayPointer(y);
    if (prVar7 != prVar8 && (prVar8 != (realtype *)0x0 && prVar7 != (realtype *)0x0)) {
      plVar1 = (long *)A->content;
      lVar2 = *plVar1;
      lVar10 = 0;
      lVar11 = 0;
      if (0 < lVar2) {
        lVar11 = lVar2;
      }
      for (; lVar11 != lVar10; lVar10 = lVar10 + 1) {
        prVar8[lVar10] = 0.0;
      }
      iVar9 = 0;
      lVar11 = plVar1[1];
      if (plVar1[1] < 1) {
        lVar11 = 0;
      }
      lVar10 = 0;
      for (lVar12 = 0; lVar12 != lVar11; lVar12 = lVar12 + 1) {
        lVar3 = plVar1[5];
        lVar13 = lVar12 - plVar1[3];
        if (lVar12 - plVar1[3] < 1) {
          lVar13 = 0;
        }
        lVar14 = plVar1[4] + lVar12;
        if (lVar2 <= plVar1[4] + lVar12) {
          lVar14 = lVar2 + -1;
        }
        lVar4 = *(long *)(plVar1[8] + lVar12 * 8);
        for (; lVar13 <= lVar14; lVar13 = lVar13 + 1) {
          prVar8[lVar13] =
               *(double *)(lVar10 + lVar3 * 8 + lVar4 + lVar13 * 8) * prVar7[lVar12] +
               prVar8[lVar13];
        }
        lVar10 = lVar10 + -8;
      }
    }
  }
  return iVar9;
}

Assistant:

int SUNMatMatvec_Band(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j, is, ie;
  realtype *col_j, *xd, *yd;
  
  /* Verify that A, x and y are compatible */
  if (!SMCompatible2_Band(A, x, y))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return 1;

  /* Perform operation */
  for (i=0; i<SM_ROWS_B(A); i++)
    yd[i] = ZERO;
  for(j=0; j<SM_COLUMNS_B(A); j++) {
    col_j = SM_COLUMN_B(A,j);
    is = SUNMAX(0, j-SM_UBAND_B(A));
    ie = SUNMIN(SM_ROWS_B(A)-1, j+SM_LBAND_B(A));
    for (i=is; i<=ie; i++)
      yd[i] += col_j[i-j]*xd[j];
  }
  return 0;
}